

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_macro_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindMacro
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *function,
          ScalarMacroCatalogEntry *macro_func,idx_t depth,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr)

{
  type extra_stack;
  StackChecker<duckdb::ExpressionBinder> stack_checker;
  
  extra_stack = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr);
  StackCheck((ExpressionBinder *)&stack_checker,(ParsedExpression *)this,(idx_t)extra_stack);
  UnfoldMacroExpression(this,function,macro_func,expr);
  (*this->_vptr_ExpressionBinder[5])(__return_storage_ptr__,this,expr,depth,0);
  (stack_checker.recursive_class)->stack_depth =
       (stack_checker.recursive_class)->stack_depth - stack_checker.stack_usage;
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindMacro(FunctionExpression &function, ScalarMacroCatalogEntry &macro_func, idx_t depth,
                                       unique_ptr<ParsedExpression> &expr) {
	auto stack_checker = StackCheck(*expr, 3);

	// unfold the macro expression
	UnfoldMacroExpression(function, macro_func, expr);

	// bind the unfolded macro
	return BindExpression(expr, depth);
}